

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenuPrivate::syncPlatformMenu(QMenuPrivate *this)

{
  Data *pDVar1;
  QWidget *this_00;
  QObject *pQVar2;
  QAction **ppQVar3;
  QPlatformMenuItem *beforeItem;
  long lVar4;
  long in_FS_OFFSET;
  QList<QAction_*> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->platformMenu).wp.d;
  if (((pDVar1 != (Data *)0x0) &&
      (this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8, *(int *)(pDVar1 + 4) != 0))
     && ((this->platformMenu).wp.value != (QObject *)0x0)) {
    local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::actions(&local_48,this_00);
    ppQVar3 = local_48.d.ptr;
    if ((undefined1 *)local_48.d.size != (undefined1 *)0x0) {
      lVar4 = local_48.d.size << 3;
      beforeItem = (QPlatformMenuItem *)0x0;
      do {
        beforeItem = insertActionInPlatformMenu
                               (this,*(QAction **)((long)ppQVar3 + lVar4 + -8),beforeItem);
        lVar4 = lVar4 + -8;
      } while (lVar4 != 0);
    }
    pQVar2 = (this->platformMenu).wp.value;
    (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,(*(ushort *)&this->field_0x420 & 8) >> 3);
    pQVar2 = (this->platformMenu).wp.value;
    (**(code **)(*(long *)pQVar2 + 0xa0))(pQVar2,(this_00->data->widget_attributes & 1) == 0);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::syncPlatformMenu()
{
    Q_Q(QMenu);
    if (platformMenu.isNull())
        return;

    QPlatformMenuItem *beforeItem = nullptr;
    const QList<QAction*> actions = q->actions();
    for (QList<QAction*>::const_reverse_iterator it = actions.rbegin(), end = actions.rend(); it != end; ++it) {
        QPlatformMenuItem *menuItem = insertActionInPlatformMenu(*it, beforeItem);
        beforeItem = menuItem;
    }
    platformMenu->syncSeparatorsCollapsible(collapsibleSeparators);
    platformMenu->setEnabled(q->isEnabled());
}